

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

mbedtls_ecp_group_id mbedtls_ecc_group_of_psa(psa_ecc_curve_t curve,size_t byte_length)

{
  mbedtls_ecp_group_id mVar1;
  mbedtls_ecp_group_id mVar2;
  undefined3 in_register_00000039;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000039,curve);
  mVar2 = MBEDTLS_ECP_DP_NONE;
  if (iVar3 < 0x30) {
    if (iVar3 == 0x12) {
      if ((long)byte_length < 0x20) {
        if (byte_length == 0x18) {
          return MBEDTLS_ECP_DP_SECP192R1;
        }
        if (byte_length == 0x1c) {
          return MBEDTLS_ECP_DP_SECP224R1;
        }
      }
      else {
        if (byte_length == 0x20) {
          return MBEDTLS_ECP_DP_SECP256R1;
        }
        if (byte_length == 0x30) {
          return MBEDTLS_ECP_DP_SECP384R1;
        }
        if (byte_length == 0x42) {
          return MBEDTLS_ECP_DP_SECP521R1;
        }
      }
      return MBEDTLS_ECP_DP_NONE;
    }
    if (iVar3 == 0x17) {
      if (byte_length == 0x18) {
        return MBEDTLS_ECP_DP_SECP192K1;
      }
      if (byte_length == 0x20) {
        mVar2 = MBEDTLS_ECP_DP_SECP256K1;
      }
      else if (byte_length == 0x1c) {
        return MBEDTLS_ECP_DP_SECP224K1;
      }
    }
  }
  else if (iVar3 == 0x30) {
    if (byte_length == 0x20) {
      return MBEDTLS_ECP_DP_BP256R1;
    }
    if (byte_length == 0x40) {
      return MBEDTLS_ECP_DP_BP512R1;
    }
    if (byte_length == 0x30) {
      return MBEDTLS_ECP_DP_BP384R1;
    }
  }
  else {
    mVar2 = MBEDTLS_ECP_DP_NONE;
    if (iVar3 == 0x41) {
      mVar2 = MBEDTLS_ECP_DP_CURVE448;
      if (byte_length != 0x38) {
        mVar2 = MBEDTLS_ECP_DP_NONE;
      }
      mVar1 = MBEDTLS_ECP_DP_CURVE25519;
      if (byte_length != 0x20) {
        mVar1 = mVar2;
      }
      return mVar1;
    }
  }
  return mVar2;
}

Assistant:

mbedtls_ecp_group_id mbedtls_ecc_group_of_psa( psa_ecc_curve_t curve,
                                               size_t byte_length )
{
    switch( curve )
    {
        case PSA_ECC_CURVE_SECP_R1:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 192 ):
                    return( MBEDTLS_ECP_DP_SECP192R1 );
                case PSA_BITS_TO_BYTES( 224 ):
                    return( MBEDTLS_ECP_DP_SECP224R1 );
                case PSA_BITS_TO_BYTES( 256 ):
                    return( MBEDTLS_ECP_DP_SECP256R1 );
                case PSA_BITS_TO_BYTES( 384 ):
                    return( MBEDTLS_ECP_DP_SECP384R1 );
                case PSA_BITS_TO_BYTES( 521 ):
                    return( MBEDTLS_ECP_DP_SECP521R1 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        case PSA_ECC_CURVE_BRAINPOOL_P_R1:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 256 ):
                    return( MBEDTLS_ECP_DP_BP256R1 );
                case PSA_BITS_TO_BYTES( 384 ):
                    return( MBEDTLS_ECP_DP_BP384R1 );
                case PSA_BITS_TO_BYTES( 512 ):
                    return( MBEDTLS_ECP_DP_BP512R1 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        case PSA_ECC_CURVE_MONTGOMERY:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 255 ):
                    return( MBEDTLS_ECP_DP_CURVE25519 );
                case PSA_BITS_TO_BYTES( 448 ):
                    return( MBEDTLS_ECP_DP_CURVE448 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        case PSA_ECC_CURVE_SECP_K1:
            switch( byte_length )
            {
                case PSA_BITS_TO_BYTES( 192 ):
                    return( MBEDTLS_ECP_DP_SECP192K1 );
                case PSA_BITS_TO_BYTES( 224 ):
                    return( MBEDTLS_ECP_DP_SECP224K1 );
                case PSA_BITS_TO_BYTES( 256 ):
                    return( MBEDTLS_ECP_DP_SECP256K1 );
                default:
                    return( MBEDTLS_ECP_DP_NONE );
            }
            break;

        default:
            return( MBEDTLS_ECP_DP_NONE );
    }
}